

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusservicewatcher.cpp
# Opt level: O0

void __thiscall
QDBusServiceWatcher::QDBusServiceWatcher
          (QDBusServiceWatcher *this,QString *service,QDBusConnection *connection,
          WatchMode watchMode,QObject *parent)

{
  long lVar1;
  QDBusServiceWatcherPrivate *this_00;
  QStringList *in_RDX;
  QDBusServiceWatcherPrivate *in_RSI;
  QObject *in_RDI;
  QObject *in_R8;
  long in_FS_OFFSET;
  parameter_type in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDBusServiceWatcherPrivate *)operator_new(0xa0);
  QDBusServiceWatcherPrivate::QDBusServiceWatcherPrivate
            (this_00,(QDBusConnection *)in_stack_ffffffffffffff88,
             (QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4>)
             SUB84((ulong)in_RDI >> 0x20,0));
  QObject::QObject(in_RDI,&this_00->super_QObjectPrivate,in_R8);
  *(undefined ***)in_RDI = &PTR_metaObject_002b7108;
  d_func((QDBusServiceWatcher *)0x23207c);
  QList<QString>::QList((QList<QString> *)0x2320a1);
  QList<QString>::operator<<((QList<QString> *)this_00,in_stack_ffffffffffffff88);
  QDBusServiceWatcherPrivate::setConnection(in_RSI,in_RDX,(QDBusConnection *)in_R8,parent._4_4_);
  QList<QString>::~QList((QList<QString> *)0x2320d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDBusServiceWatcher::QDBusServiceWatcher(const QString &service, const QDBusConnection &connection, WatchMode watchMode, QObject *parent)
    : QObject(*new QDBusServiceWatcherPrivate(connection, watchMode), parent)
{
    d_func()->setConnection(QStringList() << service, connection, watchMode);
}